

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_append_entries(raft_server *this,req_msg *req)

{
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *this_00;
  int iVar1;
  log_val_type lVar2;
  _func_int **pp_Var3;
  long *plVar4;
  element_type *peVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  reference pvVar9;
  buffer *pbVar10;
  __shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  char *pcVar12;
  unsigned_long args;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  ulong args_00;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  shared_ptr<cornerstone::resp_msg> sVar17;
  undefined1 auVar18 [16];
  ptr<resp_msg> pVar19;
  allocator<char> local_159;
  ptr<log_entry> old_entry;
  ptr<log_entry> entry;
  undefined8 local_120 [4];
  undefined1 local_100 [200];
  char *local_38;
  
  if (*(element_type **)(in_RDX + 8) ==
      ((req[3].log_entries_.
        super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
    iVar1 = *(int *)&req[3].log_entries_.
                     super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    if (iVar1 == 2) {
      become_follower((raft_server *)req);
    }
    else {
      if (iVar1 == 3) {
        plVar4 = (long *)req[4].last_log_term_;
        local_38 = 
        "Receive AppendEntriesRequest from another leader(%d) with same term, there must be a bug, server exits"
        ;
        pcVar12 = strfmt<200>::fmt<int>((strfmt<200> *)local_100,*(int *)(in_RDX + 0x14));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_120,pcVar12,(allocator<char> *)&old_entry);
        (**(code **)(*plVar4 + 0x10))(plVar4,local_120);
        std::__cxx11::string::~string((string *)local_120);
        peVar5 = (((req->log_entries_).
                   super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (**(code **)(peVar5->term_ + 0x40))(peVar5,0xffffffff);
        exit(-1);
      }
      restart_election_timer((raft_server *)req);
    }
  }
  local_100._0_8_ =
       ((req[3].log_entries_.
         super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->
       super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  old_entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 4;
  entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       *(undefined4 *)(in_RDX + 0x14);
  local_120[0] = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
  sVar17 = std::
           make_shared<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int,unsigned_long>
                     ((unsigned_long *)this,(msg_type *)local_100,(int *)&old_entry,
                      (int *)((long)&(req->super_msg_base).term_ + 4),(unsigned_long *)&entry);
  _Var13 = sVar17.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  uVar15 = *(ulong *)(in_RDX + 0x28);
  if (uVar15 == 0) {
    bVar16 = false;
  }
  else {
    auVar18 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
    _Var13._M_pi = auVar18._8_8_;
    bVar16 = true;
    if (uVar15 < auVar18._0_8_) {
      uVar8 = *(ulong *)(in_RDX + 0x20);
      uVar6 = term_for_log((raft_server *)req,*(ulong *)(in_RDX + 0x28));
      bVar16 = uVar8 != uVar6;
      _Var13._M_pi = extraout_RDX;
    }
  }
  if ((!bVar16) &&
     (((req[3].log_entries_.
        super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr <=
      *(element_type **)(in_RDX + 8))) {
    if (*(long *)(in_RDX + 0x40) != *(long *)(in_RDX + 0x38)) {
      this_00 = (vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 *)(in_RDX + 0x38);
      lVar14 = *(long *)(in_RDX + 0x28) + 1;
      for (uVar15 = 0;
          (uVar7 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))(),
          lVar14 + uVar15 < uVar7 &&
          (uVar15 < (ulong)(*(long *)(in_RDX + 0x40) - *(long *)(in_RDX + 0x38) >> 4)));
          uVar15 = uVar15 + 1) {
        uVar8 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x48))();
        pvVar9 = std::
                 vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ::at(this_00,uVar15);
        if (uVar8 != ((pvVar9->
                      super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     )->term_) break;
      }
      while( true ) {
        uVar7 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
        args_00 = lVar14 + uVar15;
        if ((uVar7 <= args_00) ||
           ((ulong)(*(long *)(in_RDX + 0x40) - *(long *)(in_RDX + 0x38) >> 4) <= uVar15)) break;
        pp_Var3 = req[4].super_msg_base._vptr_msg_base;
        (**(code **)(*pp_Var3 + 0x40))(&old_entry,pp_Var3,args_00);
        lVar2 = ((log_entry *)
                CONCAT44(old_entry.
                         super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._4_4_,
                         old_entry.
                         super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._0_4_))->value_type_;
        if (lVar2 == conf) {
          plVar4 = (long *)req[4].last_log_term_;
          local_100._104_8_ = "revert from a prev config change to config at %llu";
          pcVar12 = strfmt<100>::fmt<unsigned_long>
                              ((strfmt<100> *)local_100,
                               (unsigned_long)*req[5].super_msg_base._vptr_msg_base);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_120,pcVar12,(allocator<char> *)&entry);
          (**(code **)(*plVar4 + 0x18))(plVar4,(string *)local_120);
          std::__cxx11::string::~string((string *)local_120);
          *(undefined1 *)((long)&req->last_log_idx_ + 1) = 0;
        }
        else if (lVar2 == app_log) {
          plVar4 = *(long **)&req[4].super_msg_base.type_;
          pbVar10 = log_entry::get_buf((log_entry *)
                                       CONCAT44(old_entry.
                                                super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._4_4_,
                                                old_entry.
                                                super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._0_4_));
          (**(code **)(*plVar4 + 0x20))
                    (plVar4,args_00,pbVar10,
                     CONCAT44(old_entry.
                              super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,
                              old_entry.
                              super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._0_4_) + 0x20);
        }
        p_Var11 = &std::
                   vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                   ::at(this_00,uVar15)->
                   super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>,
                   p_Var11);
        pp_Var3 = req[4].super_msg_base._vptr_msg_base;
        (**(code **)(*pp_Var3 + 0x30))
                  (pp_Var3,args_00,
                   &entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>);
        lVar2 = ((log_entry *)
                CONCAT44(entry.
                         super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._4_4_,
                         entry.
                         super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._0_4_))->value_type_;
        if (lVar2 == conf) {
          plVar4 = (long *)req[4].last_log_term_;
          local_100._104_8_ = "receive a config change from leader at %llu";
          pcVar12 = strfmt<100>::fmt<unsigned_long>((strfmt<100> *)local_100,args_00);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_120,pcVar12,&local_159)
          ;
          (**(code **)(*plVar4 + 0x18))(plVar4,(string *)local_120);
          std::__cxx11::string::~string((string *)local_120);
          *(undefined1 *)((long)&req->last_log_idx_ + 1) = 1;
        }
        else if (lVar2 == app_log) {
          plVar4 = *(long **)&req[4].super_msg_base.type_;
          pbVar10 = log_entry::get_buf((log_entry *)
                                       CONCAT44(entry.
                                                super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._4_4_,
                                                entry.
                                                super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._0_4_));
          (**(code **)(*plVar4 + 0x18))
                    (plVar4,args_00,pbVar10,
                     CONCAT44(entry.
                              super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,
                              entry.
                              super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._0_4_) + 0x20);
        }
        uVar15 = uVar15 + 1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&old_entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      for (; uVar15 < (ulong)(*(long *)(in_RDX + 0x40) - *(long *)(in_RDX + 0x38) >> 4);
          uVar15 = uVar15 + 1) {
        p_Var11 = &std::
                   vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                   ::at(this_00,uVar15)->
                   super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&old_entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                   ,p_Var11);
        pp_Var3 = req[4].super_msg_base._vptr_msg_base;
        args = (**(code **)(*pp_Var3 + 0x28))
                         (pp_Var3,&old_entry.
                                   super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                         );
        lVar2 = ((log_entry *)
                CONCAT44(old_entry.
                         super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._4_4_,
                         old_entry.
                         super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._0_4_))->value_type_;
        if (lVar2 == app_log) {
          plVar4 = *(long **)&req[4].super_msg_base.type_;
          pbVar10 = log_entry::get_buf((log_entry *)
                                       CONCAT44(old_entry.
                                                super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._4_4_,
                                                old_entry.
                                                super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._0_4_));
          (**(code **)(*plVar4 + 0x18))
                    (plVar4,args,pbVar10,
                     CONCAT44(old_entry.
                              super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,
                              old_entry.
                              super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._0_4_) + 0x20);
        }
        else if (lVar2 == conf) {
          plVar4 = (long *)req[4].last_log_term_;
          local_100._104_8_ = "receive a config change from leader at %llu";
          pcVar12 = strfmt<100>::fmt<unsigned_long>((strfmt<100> *)local_100,args);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_120,pcVar12,(allocator<char> *)&entry);
          (**(code **)(*plVar4 + 0x18))(plVar4,(string *)local_120);
          std::__cxx11::string::~string((string *)local_120);
          *(undefined1 *)((long)&req->last_log_idx_ + 1) = 1;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&old_entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
    }
    *(undefined4 *)&(req->super_msg_base).term_ = *(undefined4 *)(in_RDX + 0x14);
    commit((raft_server *)req,*(ulong *)(in_RDX + 0x30));
    pp_Var3 = this->_vptr_raft_server;
    _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)(in_RDX + 0x40) - *(long *)(in_RDX + 0x38) >> 4);
    pp_Var3[4] = (_func_int *)
                 ((long)&(_Var13._M_pi)->_vptr__Sp_counted_base + *(long *)(in_RDX + 0x28) + 1);
    *(undefined1 *)(pp_Var3 + 5) = 1;
  }
  pVar19.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  pVar19.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar19.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_append_entries(req_msg& req)
{
    if (req.get_term() == state_->get_term())
    {
        if (role_ == srv_role::candidate)
        {
            become_follower();
        }
        else if (role_ == srv_role::leader)
        {
            l_->debug(lstrfmt("Receive AppendEntriesRequest from another leader(%d) with same term, there must be a "
                              "bug, server exits")
                          .fmt(req.get_src()));
            ctx_->state_mgr_->system_exit(-1);
            ::exit(-1);
        }
        else
        {
            restart_election_timer();
        }
    }

    // After a snapshot the req.get_last_log_idx() may less than log_store_->next_slot() but equals to
    // log_store_->next_slot() -1 In this case, log is Okay if req.get_last_log_idx() == lastSnapshot.get_last_log_idx()
    // && req.get_last_log_term() == lastSnapshot.get_last_log_term() In not accepted case, we will return
    // log_store_->next_slot() for the leader to quick jump to the index that might aligned
    ptr<resp_msg> resp(cs_new<resp_msg>(
        state_->get_term(), msg_type::append_entries_response, id_, req.get_src(), log_store_->next_slot()));
    bool log_okay = req.get_last_log_idx() == 0 || (req.get_last_log_idx() < log_store_->next_slot() &&
                                                    req.get_last_log_term() == term_for_log(req.get_last_log_idx()));
    if (req.get_term() < state_->get_term() || !log_okay)
    {
        return resp;
    }

    // follower & log is okay
    if (req.log_entries().size() > 0)
    {
        // write logs to store, start from overlapped logs
        ulong idx = req.get_last_log_idx() + 1;
        size_t log_idx = 0;
        while (idx < log_store_->next_slot() && log_idx < req.log_entries().size())
        {
            if (log_store_->term_at(idx) == req.log_entries().at(log_idx)->get_term())
            {
                idx++;
                log_idx++;
            }
            else
            {
                break;
            }
        }

        // dealing with overwrites
        while (idx < log_store_->next_slot() && log_idx < req.log_entries().size())
        {
            ptr<log_entry> old_entry(log_store_->entry_at(idx));
            if (old_entry->get_val_type() == log_val_type::app_log)
            {
                state_machine_->rollback(idx, old_entry->get_buf(), old_entry->get_cookie());
            }
            else if (old_entry->get_val_type() == log_val_type::conf)
            {
                l_->info(sstrfmt("revert from a prev config change to config at %llu").fmt(config_->get_log_idx()));
                config_changing_ = false;
            }

            ptr<log_entry> entry = req.log_entries().at(log_idx);
            log_store_->write_at(idx, entry);
            if (entry->get_val_type() == log_val_type::app_log)
            {
                state_machine_->pre_commit(idx, entry->get_buf(), entry->get_cookie());
            }
            else if (entry->get_val_type() == log_val_type::conf)
            {
                l_->info(sstrfmt("receive a config change from leader at %llu").fmt(idx));
                config_changing_ = true;
            }

            idx += 1;
            log_idx += 1;
        }

        // append new log entries
        while (log_idx < req.log_entries().size())
        {
            ptr<log_entry> entry = req.log_entries().at(log_idx++);
            ulong idx_for_entry = log_store_->append(entry);
            if (entry->get_val_type() == log_val_type::conf)
            {
                l_->info(sstrfmt("receive a config change from leader at %llu").fmt(idx_for_entry));
                config_changing_ = true;
            }
            else if (entry->get_val_type() == log_val_type::app_log)
            {
                state_machine_->pre_commit(idx_for_entry, entry->get_buf(), entry->get_cookie());
            }
        }
    }

    leader_ = req.get_src();
    commit(req.get_commit_idx());
    resp->accept(req.get_last_log_idx() + req.log_entries().size() + 1);
    return resp;
}